

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O1

void deserialize_model<char_const*,long,unsigned_long>
               (Imputer *model,char **in,vector<char,_std::allocator<char>_> *buffer,
               bool diff_endian,bool lacks_range_penalty,bool lacks_scoring_metric)

{
  vector<int,_std::allocator<int>_> *this;
  vector<double,_std::allocator<double>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  size_t *psVar1;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *pvVar2;
  pointer pIVar3;
  ImputeNode *node;
  pointer node_00;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *__range2;
  size_t n_els;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *this_02;
  size_t veclen;
  size_t data_sizets [6];
  size_type local_70;
  size_t local_68;
  size_t sStack_60;
  size_type local_58;
  size_t sStack_50;
  size_t local_48;
  size_t sStack_40;
  
  if (!interrupt_switch) {
    psVar1 = (size_t *)*in;
    local_68 = *psVar1;
    sStack_60 = psVar1[1];
    local_58 = psVar1[2];
    sStack_50 = psVar1[3];
    local_48 = psVar1[4];
    sStack_40 = psVar1[5];
    *in = (char *)(psVar1 + 6);
    if (diff_endian) {
      swap_endianness<unsigned_long>(&local_68,6);
    }
    model->ncols_numeric = local_68;
    model->ncols_categ = sStack_60;
    this = &model->ncat;
    std::vector<int,_std::allocator<int>_>::resize(this,local_58);
    std::
    vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
    ::resize(&model->imputer_tree,sStack_50);
    this_00 = &model->col_means;
    std::vector<double,_std::allocator<double>_>::resize(this_00,local_48);
    this_01 = &model->col_modes;
    std::vector<int,_std::allocator<int>_>::resize(this_01,sStack_40);
    if ((model->ncat).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage !=
        (model->ncat).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      std::__shrink_to_fit_aux<std::vector<int,_std::allocator<int>_>,_true>::_S_do_it(this);
    }
    if ((model->imputer_tree).
        super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage !=
        (model->imputer_tree).
        super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      __shrink_to_fit_aux<std::vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>,_true>
      ::_S_do_it(&model->imputer_tree);
    }
    if ((model->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage !=
        (model->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it
                (this_00);
    }
    if ((model->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage !=
        (model->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__shrink_to_fit_aux<std::vector<int,_std::allocator<int>_>,_true>::_S_do_it(this_01);
    }
    read_bytes<int,long>
              (this,(long)(model->ncat).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(model->ncat).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2,in,buffer,diff_endian);
    n_els = (long)(model->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(model->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    read_bytes<double>(this_00,n_els,in);
    if (diff_endian) {
      swap_endianness<double>
                ((this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start,n_els);
    }
    read_bytes<int,long>
              (this_01,(long)(model->col_modes).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(model->col_modes).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 2,in,buffer,diff_endian);
    pvVar2 = (model->imputer_tree).
             super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_02 = (model->imputer_tree).
                   super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_02 != pvVar2;
        this_02 = this_02 + 1) {
      local_70 = *(size_type *)*in;
      *in = (char *)((long)*in + 8);
      if (diff_endian) {
        swap_endianness<unsigned_long>(&local_70,1);
      }
      std::vector<ImputeNode,_std::allocator<ImputeNode>_>::resize(this_02,local_70);
      if ((this_02->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage !=
          (this_02->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        std::__shrink_to_fit_aux<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_true>::
        _S_do_it(this_02);
      }
      pIVar3 = (this_02->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (node_00 = (this_02->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
                     super__Vector_impl_data._M_start; node_00 != pIVar3; node_00 = node_00 + 1) {
        deserialize_node<char_const*,long,unsigned_long>(node_00,in,buffer,diff_endian);
      }
    }
  }
  return;
}

Assistant:

void deserialize_model(Imputer &model, itype &in, std::vector<char> &buffer,
                       const bool diff_endian, const bool lacks_range_penalty,
                       const bool lacks_scoring_metric)
{
    if (interrupt_switch) return;

    size_t data_sizets[6];
    read_bytes<size_t, saved_size_t>((void*)data_sizets, (size_t)6, in, buffer, diff_endian);
    model.ncols_numeric = data_sizets[0];
    model.ncols_categ = data_sizets[1];
    model.ncat.resize(data_sizets[2]);
    model.imputer_tree.resize(data_sizets[3]);
    model.col_means.resize(data_sizets[4]);
    model.col_modes.resize(data_sizets[5]);

    model.ncat.shrink_to_fit();
    model.imputer_tree.shrink_to_fit();
    model.col_means.shrink_to_fit();
    model.col_modes.shrink_to_fit();

    read_bytes<int, saved_int_t>(model.ncat, model.ncat.size(), in, buffer, diff_endian);

    read_bytes<double, double>(model.col_means, model.col_means.size(), in, buffer, diff_endian);

    read_bytes<int, saved_int_t>(model.col_modes, model.col_modes.size(), in, buffer, diff_endian);

    size_t veclen;
    for (auto &tree : model.imputer_tree) {
        read_bytes<size_t, saved_size_t>((void*)&veclen, (size_t)1, in, buffer, diff_endian);
        tree.resize(veclen);
        tree.shrink_to_fit();
        for (auto &node : tree)
            deserialize_node<itype, saved_int_t, saved_size_t>(node, in, buffer, diff_endian);
    }
}